

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

Am_Drawonable * __thiscall Screen_Manager::Member(Screen_Manager *this,Display *dpy)

{
  Screen_Info **ppSVar1;
  Screen_Info *pSVar2;
  Screen_Info *pSVar3;
  
  pSVar2 = this->head;
  pSVar3 = pSVar2;
  if (pSVar2 != (Screen_Info *)0x0) {
    do {
      if (pSVar3->dpy == dpy) {
        return pSVar3->draw;
      }
      ppSVar1 = &pSVar3->next;
      pSVar3 = *ppSVar1;
    } while (*ppSVar1 != pSVar2);
  }
  return (Am_Drawonable *)0x0;
}

Assistant:

Am_Drawonable *
Screen_Manager::Member(Display *dpy)
{
  if (!head)
    return nullptr;
  Screen_Info *screen = head;
  do {
    if (screen->dpy == dpy)
      return screen->draw;
    screen = screen->next;
  } while (screen != head);

  return nullptr;
}